

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O3

void __thiscall CodeEmitter::emitterError(CodeEmitter *this,string *errorMessage)

{
  logic_error *this_00;
  stringstream ss;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Code emitter error: ",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(errorMessage->_M_dataplus)._M_p,errorMessage->_M_string_length);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,local_1c0);
  *(undefined ***)this_00 = &PTR__logic_error_00113d40;
  __cxa_throw(this_00,&CodeEmitterError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CodeEmitter::emitterError(std::string errorMessage) {
    std::stringstream ss;
    ss << "Code emitter error: " << errorMessage;
    throw CodeEmitterError{ ss.str() };
}